

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O3

TA_RetCode
TA_MAMA_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  
  TVar1 = TA_MAMA(startIdx,endIdx,(params->in->data).inReal,(params->optIn->data).optInReal,
                  params->optIn[1].data.optInReal,outBegIdx,outNBElement,(params->out->data).outReal
                  ,params->out[1].data.outReal);
  return TVar1;
}

Assistant:

TA_RetCode TA_MAMA_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_MAMA(
/* Generated */              startIdx,
/* Generated */              endIdx,
/* Generated */              params->in[0].data.inReal, /* inReal */
/* Generated */              params->optIn[0].data.optInReal, /* optInFastLimit*/
/* Generated */              params->optIn[1].data.optInReal, /* optInSlowLimit*/
/* Generated */              outBegIdx, 
/* Generated */              outNBElement, 
/* Generated */              params->out[0].data.outReal, /*  outMAMA */
/* Generated */              params->out[1].data.outReal /*  outFAMA */ );
/* Generated */ }